

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

string * __thiscall
gl4cts::GPUShaderFP64Test7::getFragmentShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test7 *this,_variables *variables)

{
  pointer p_Var1;
  uint uVar2;
  ostream *poVar3;
  ios_base *piVar4;
  _variable_type type;
  _variable_type type_00;
  int iVar5;
  _variable_type _Var6;
  char *this_00;
  int iVar7;
  byte bVar8;
  ulong uVar9;
  string variable_type_string;
  stringstream array_size_sstream;
  stringstream array_index_sstream;
  stringstream result_sstream;
  uchar local_568;
  undefined7 uStack_567;
  long local_560;
  long local_558 [2];
  ulong local_548;
  GPUShaderFP64Test7 *local_540;
  ios_base *local_538;
  ulong local_530;
  ios_base *local_528;
  GPUShaderFP64Test7 *local_520;
  ulong local_518;
  _variables *local_510;
  string local_508;
  string *local_4e8;
  ios_base *local_4e0;
  pointer local_4d8;
  pointer local_4d0;
  undefined1 local_4c8 [128];
  ios_base aiStack_448 [264];
  char *local_340;
  long local_338;
  undefined1 local_330 [112];
  undefined1 auStack_2c0 [280];
  undefined1 local_1a8 [376];
  
  local_510 = variables;
  local_4e8 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)(auStack_2c0 + 0x108));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#version 400\n\n",0xe);
  this_00 = "in GS_DATA\n{\n";
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in GS_DATA\n{\n",0xd);
  getVariableDeclarations_abi_cxx11_
            ((string *)local_4c8,(GPUShaderFP64Test7 *)this_00,"gs",local_510,"flat");
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_4c8._0_8_,local_4c8._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"};\n\n",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "out vec4 result;\n\nvoid main()\n{\nconst double epsilon = 1e-5;\n\nresult = vec4(1, 0, 0, 0);\n\n"
             ,0x5a);
  if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
    operator_delete((void *)local_4c8._0_8_,local_4c8._16_8_ + 1);
  }
  local_4d0 = (local_510->
              super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
              )._M_impl.super__Vector_impl_data._M_start;
  local_4d8 = (local_510->
              super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  local_4e0 = (ios_base *)(((long)local_4d8 - (long)local_4d0 >> 2) * -0x5555555555555555);
  if (local_4d8 != local_4d0) {
    local_540 = (GPUShaderFP64Test7 *)auStack_2c0;
    local_528 = aiStack_448;
    piVar4 = (ios_base *)0x0;
    uVar9 = 1;
    local_520 = this;
    do {
      p_Var1 = (local_510->
               super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_548 = (ulong)p_Var1[(long)piVar4].array_size;
      _Var6 = p_Var1[(long)piVar4].type;
      local_538 = piVar4;
      uVar2 = Utils::getNumberOfComponentsForVariableType(_Var6);
      Utils::getVariableTypeString_abi_cxx11_(&local_508,(Utils *)(ulong)_Var6,type);
      std::__cxx11::stringstream::stringstream((stringstream *)local_4c8);
      if (1 < (uint)local_548) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4c8 + 0x10),"[",1);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)(local_4c8 + 0x10));
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
      }
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_508._M_dataplus._M_p,local_508._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," expected_variable",0x12);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__cxx11::stringbuf::str();
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_340,local_338);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,";\n\n",3);
      if (local_340 != local_330) {
        operator_delete(local_340,local_330._0_8_ + 1);
      }
      if (local_548 != 0) {
        local_530 = 0;
        do {
          std::__cxx11::stringstream::stringstream((stringstream *)&local_340);
          local_518 = uVar9;
          if (1 < (uint)local_548) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"[",1);
            poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_330);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"expected_variable",0x11);
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__cxx11::stringbuf::str();
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar3,(char *)CONCAT71(uStack_567,local_568),local_560);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar3,local_508._M_dataplus._M_p,local_508._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
          if ((long *)CONCAT71(uStack_567,local_568) != local_558) {
            operator_delete((long *)CONCAT71(uStack_567,local_568),local_558[0] + 1);
          }
          iVar5 = 0;
          do {
            std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            if (uVar2 + iVar5 != 1) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
            }
            iVar5 = iVar5 + -1;
          } while (uVar2 + iVar5 != 0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,");\n",3);
          iVar7 = (int)local_518;
          uVar9 = (ulong)(uint)(iVar7 - iVar5);
          std::__cxx11::stringstream::~stringstream((stringstream *)&local_340);
          std::ios_base::~ios_base((ios_base *)local_540);
          local_530 = local_530 + 1;
        } while (local_530 != local_548);
        uVar9 = (ulong)(uint)(iVar7 - iVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_4c8);
      std::ios_base::~ios_base(local_528);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_508._M_dataplus._M_p != &local_508.field_2) {
        operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
      }
      piVar4 = (ios_base *)(ulong)((int)local_538 + 1);
    } while (piVar4 < local_4e0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"if (",4);
  if (local_4d8 != local_4d0) {
    local_538 = (ios_base *)auStack_2c0;
    local_528 = aiStack_448;
    piVar4 = (ios_base *)0x0;
    do {
      p_Var1 = (local_510->
               super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_520 = (GPUShaderFP64Test7 *)(ulong)p_Var1[(long)piVar4].array_size;
      _Var6 = p_Var1[(long)piVar4].type;
      uVar2 = Utils::getNumberOfComponentsForVariableType(_Var6);
      local_518 = CONCAT44(local_518._4_4_,uVar2);
      Utils::getVariableTypeString_abi_cxx11_(&local_508,(Utils *)(ulong)_Var6,type_00);
      if (local_520 != (GPUShaderFP64Test7 *)0x0) {
        bVar8 = _Var6 < VARIABLE_TYPE_UINT & (byte)(0x7fc03fe0 >> ((byte)_Var6 & 0x1f));
        local_548 = local_518 & 0xffffffff;
        local_540 = (GPUShaderFP64Test7 *)0x0;
        local_530 = CONCAT44(local_530._4_4_,_Var6);
        do {
          std::__cxx11::stringstream::stringstream((stringstream *)local_4c8);
          if ((int)local_520 != 1) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4c8 + 0x10),"[",1);
            poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)(local_4c8 + 0x10));
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
          }
          uVar9 = 0;
          do {
            std::__cxx11::stringstream::stringstream((stringstream *)&local_340);
            if (1 < (uint)local_518) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"[",1);
              poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_330);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"abs(expected_variable",0x15);
            poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__cxx11::stringbuf::str();
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar3,(char *)CONCAT71(uStack_567,local_568),local_560);
            if ((long *)CONCAT71(uStack_567,local_568) != local_558) {
              operator_delete((long *)CONCAT71(uStack_567,local_568),local_558[0] + 1);
            }
            if (bVar8 == 0) {
              std::__cxx11::stringbuf::str();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)CONCAT71(uStack_567,local_568),local_560);
              if ((long *)CONCAT71(uStack_567,local_568) != local_558) {
                operator_delete((long *)CONCAT71(uStack_567,local_568),local_558[0] + 1);
              }
            }
            else {
              uVar2 = Utils::getNumberOfColumnsForVariableType(_Var6);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
              poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,"].",2);
              local_568 = Utils::getComponentAtIndex((uint)((uVar9 & 0xffffffff) / (ulong)uVar2));
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_568,1);
              _Var6 = (_variable_type)local_530;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8," - gs_variable",0xe);
            poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__cxx11::stringbuf::str();
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar3,(char *)CONCAT71(uStack_567,local_568),local_560);
            if ((long *)CONCAT71(uStack_567,local_568) != local_558) {
              operator_delete((long *)CONCAT71(uStack_567,local_568),local_558[0] + 1);
            }
            if (bVar8 == 0) {
              std::__cxx11::stringbuf::str();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)CONCAT71(uStack_567,local_568),local_560);
              if ((long *)CONCAT71(uStack_567,local_568) != local_558) {
                operator_delete((long *)CONCAT71(uStack_567,local_568),local_558[0] + 1);
              }
            }
            else {
              uVar2 = Utils::getNumberOfColumnsForVariableType(_Var6);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
              poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,"].",2);
              local_568 = Utils::getComponentAtIndex((uint)((uVar9 & 0xffffffff) / (ulong)uVar2));
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_568,1);
              _Var6 = (_variable_type)local_530;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,") <= epsilon &&",0xf);
            std::__cxx11::stringstream::~stringstream((stringstream *)&local_340);
            std::ios_base::~ios_base(local_538);
            uVar9 = uVar9 + 1;
          } while (local_548 != uVar9);
          std::__cxx11::stringstream::~stringstream((stringstream *)local_4c8);
          std::ios_base::~ios_base(local_528);
          local_540 = (GPUShaderFP64Test7 *)
                      ((long)&(local_540->super_TestCase).super_TestCase.super_TestNode.
                              _vptr_TestNode + 1);
        } while (local_540 != local_520);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_508._M_dataplus._M_p != &local_508.field_2) {
        operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
      }
      piVar4 = (ios_base *)(ulong)((int)piVar4 + 1);
    } while (piVar4 < local_4e0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"true)\n{\n    result = vec4(0, 1, 0, 0);\n}\n}\n",0x2b);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)(auStack_2c0 + 0x108));
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return local_4e8;
}

Assistant:

std::string GPUShaderFP64Test7::getFragmentShaderBody(const _variables& variables)
{
	std::stringstream result_sstream;

	/* Form the pre-amble */
	result_sstream << "#version 400\n"
					  "\n"

				   /* Add input block */
				   << "in GS_DATA\n"
					  "{\n"
				   << getVariableDeclarations("gs", variables, "flat") << "};\n"
																		  "\n"

				   /* Add output variable */
				   << "out vec4 result;\n"
					  "\n"

					  /* Add main() definition */
					  "void main()\n"
					  "{\n"
					  "const double epsilon = 1e-5;\n"
					  "\n"
					  "result = vec4(1, 0, 0, 0);\n"
					  "\n";

	/* Determine expected values first */
	unsigned int base_counter = 1;
	const size_t n_variables  = variables.size();

	for (unsigned int n_variable = 0; n_variable < n_variables; ++n_variable)
	{
		unsigned int		  variable_array_size		 = variables[n_variable].array_size;
		Utils::_variable_type variable_type				 = variables[n_variable].type;
		unsigned int		  n_variable_type_components = Utils::getNumberOfComponentsForVariableType(variable_type);
		std::string			  variable_type_string		 = Utils::getVariableTypeString(variable_type);

		std::stringstream array_size_sstream;

		if (variable_array_size > 1)
		{
			array_size_sstream << "[" << variable_array_size << "]";
		}

		/* Local variable declaration */
		result_sstream << variable_type_string << " expected_variable" << n_variable << array_size_sstream.str()
					   << ";\n"
						  "\n";

		/* Set expected values */
		for (unsigned int index = 0; index < variable_array_size; ++index)
		{
			std::stringstream array_index_sstream;

			if (variable_array_size > 1)
			{
				array_index_sstream << "[" << index << "]";
			}

			result_sstream << "expected_variable" << n_variable << array_index_sstream.str() << " = "
						   << variable_type_string << "(";

			for (unsigned int n_component = 0; n_component < n_variable_type_components; ++n_component)
			{
				unsigned int expected_value =
					(base_counter + 0) + (base_counter + 1) + (base_counter + 2) + (base_counter + 3);

				if (m_are_double_inputs_supported)
				{
					/* VS input attributes */
					//expected_value += (base_counter + 6);
					expected_value -= 1;
				}

				result_sstream << expected_value;

				if (n_component != (n_variable_type_components - 1))
				{
					result_sstream << ", ";
				}

				++base_counter;
			} /* for (all components) */

			result_sstream << ");\n";
		} /* for (all array indices) */

		result_sstream << "\n";
	} /* for (all variable types) */

	/* Now that we know the expected values, do a huge conditional check to verify if all
	 * input variables carry correct information.
	 */
	result_sstream << "if (";

	for (unsigned int n_variable = 0; n_variable < n_variables; ++n_variable)
	{
		unsigned int		  variable_array_size		 = variables[n_variable].array_size;
		Utils::_variable_type variable_type				 = variables[n_variable].type;
		bool				  is_variable_type_matrix	= Utils::isMatrixVariableType(variable_type);
		unsigned int		  n_variable_type_components = Utils::getNumberOfComponentsForVariableType(variable_type);
		std::string			  variable_type_string		 = Utils::getVariableTypeString(variable_type);

		for (unsigned int index = 0; index < variable_array_size; ++index)
		{
			std::stringstream array_index_sstream;

			if (variable_array_size > 1)
			{
				array_index_sstream << "[" << index << "]";
			}

			for (unsigned int n_component = 0; n_component < n_variable_type_components; ++n_component)
			{
				std::stringstream component_index_sstream;

				if (n_variable_type_components > 1)
				{
					component_index_sstream << "[" << n_component << "]";
				}

				result_sstream << "abs(expected_variable" << n_variable << array_index_sstream.str();

				if (is_variable_type_matrix)
				{
					const unsigned int n_columns = Utils::getNumberOfColumnsForVariableType(variable_type);
					const unsigned int column	= n_component % n_columns;
					const unsigned int row		 = n_component / n_columns;

					result_sstream << "[" << column << "]"
													   "."
								   << Utils::getComponentAtIndex(row);
				}
				else
				{
					result_sstream << component_index_sstream.str();
				}

				result_sstream << " - gs_variable" << n_variable << array_index_sstream.str();

				if (is_variable_type_matrix)
				{
					const unsigned int n_columns = Utils::getNumberOfColumnsForVariableType(variable_type);
					const unsigned int column	= n_component % n_columns;
					const unsigned int row		 = n_component / n_columns;

					result_sstream << "[" << column << "]"
													   "."
								   << Utils::getComponentAtIndex(row);
				}
				else
				{
					result_sstream << component_index_sstream.str();
				}

				result_sstream << ") <= epsilon &&";
			} /* for (all components) */
		}	 /* for (all array indices) */
	}		  /* for (all variable types) */

	result_sstream << "true)\n"
					  "{\n"
					  "    result = vec4(0, 1, 0, 0);\n"
					  "}\n"
					  "}\n";

	/* All done */
	return result_sstream.str();
}